

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlElement::ClearThis(TiXmlElement *this)

{
  TiXmlAttribute *removeMe;
  TiXmlAttribute *node;
  
  TiXmlNode::Clear(&this->super_TiXmlNode);
  while ((removeMe = (this->attributeSet).sentinel.next, removeMe != &(this->attributeSet).sentinel
         && (removeMe != (TiXmlAttribute *)0x0))) {
    TiXmlAttributeSet::Remove(&this->attributeSet,removeMe);
    (*(removeMe->super_TiXmlBase)._vptr_TiXmlBase[1])(removeMe);
  }
  return;
}

Assistant:

void TiXmlElement::ClearThis() {
	Clear();
	while (attributeSet.First()) {
		TiXmlAttribute* node = attributeSet.First();
		attributeSet.Remove(node);
		delete node;
	}
}